

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::
     ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Wrap,tinyusdz::GeomBasisCurves::Wrap>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::GeomBasisCurves::Wrap> *enum_handler,Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap> *result,string *warn,
               string *err)

{
  PrimVar *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vtable_type *pvVar2;
  string *this_00;
  bool bVar3;
  uint32_t uVar4;
  ostream *poVar5;
  long *plVar6;
  Attribute *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap> *args_1;
  expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  ostringstream ss_e;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined8 uStack_228;
  string *local_220;
  undefined1 local_218 [32];
  bool local_1f8;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string *local_1b0;
  optional<tinyusdz::Token> local_1a8 [2];
  ios_base local_138 [264];
  
  if (result == (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x644);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"[Internal error] `result` arg is nullptr.",0x29);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_002519af;
    ::std::__cxx11::stringbuf::str();
    plVar6 = (long *)::std::__cxx11::string::_M_append(local_218,(ulong)(err->_M_dataplus)._M_p);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar7) {
      local_238._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_238._8_8_ = plVar6[3];
      local_248._0_8_ = &local_238;
    }
    else {
      local_238._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_248._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar6 + 1);
    *plVar6 = (long)paVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != &local_238) {
      operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_218._0_8_ == local_218 + 0x10) goto LAB_002519af;
  }
  else {
    args = attr;
    args_1 = result;
    local_220 = prop_name;
    bVar3 = Attribute::is_connection(attr);
    if (bVar3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x648);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar10 = 
      "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}";
      pcVar8 = "";
LAB_00251701:
      local_218._0_8_ = local_218 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_218,pcVar10,pcVar8);
      fmt::format<std::__cxx11::string>
                ((string *)local_248,(fmt *)local_218,(string *)local_220,&args->_name);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != &local_238) {
        operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
LAB_00251770:
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
    }
    else {
      local_1b0 = warn;
      if (attr->_variability == Uniform) {
        if ((attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar2 = (attr->_var)._value.v_.vtable;
          if (pvVar2 == (vtable_type *)0x0) {
            bVar3 = false;
          }
          else {
            uVar4 = (*pvVar2->type_id)();
            bVar3 = uVar4 == 4;
          }
          if ((bVar3) || (((attr->_var)._blocked & 1U) != 0)) {
LAB_00251f14:
            result->_blocked = true;
            return true;
          }
        }
        bVar3 = primvar::PrimVar::is_timesamples(&attr->_var);
        if (!bVar3) {
          primvar::PrimVar::get_value<tinyusdz::Token>(local_1a8,&attr->_var);
          if (local_1a8[0].has_value_ == true) {
            if (local_1a8[0].contained.data.__align == (long)&local_1a8[0].contained + 0x10) {
              local_248._8_8_ = (long)local_238._M_local_buf + 8;
              uStack_228 = local_1a8[0].contained._24_8_;
            }
            else {
              local_248._8_8_ = local_1a8[0].contained.data.__align;
            }
            local_238._8_8_ = local_1a8[0].contained._16_8_;
            local_248[0] = (string)0x1;
            local_238._M_allocated_capacity = local_1a8[0].contained._8_8_;
            if ((enum_handler->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_002525ee;
            (*enum_handler->_M_invoker)
                      ((expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_218,(_Any_data *)enum_handler,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_248 + 8));
            if (local_1f8 == true) goto LAB_00252162;
            if (strict_allowedToken_check) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar9 = 0x65e;
              goto LAB_00252209;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            iVar9 = 0x660;
LAB_00252441:
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,iVar9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            paVar1 = &local_1f0.field_2;
            local_1f0._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f0,
                       "Attribute `{}`: `{}` is not an allowed token. Ignore it.","");
            if (local_248[0] == (string)0x0) {
LAB_002525f3:
              __assert_fail("has_value()",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                            ,0x591,
                            "value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() [T = tinyusdz::Token]"
                           );
            }
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_1d0,(fmt *)&local_1f0,local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_248 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,
                                local_1d0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            this_00 = local_1b0;
            if (local_1b0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_1d0,&local_1f0,err);
              ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_1d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != paVar1) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            result->_empty = true;
LAB_0025259c:
            bVar3 = true;
            goto LAB_0025259e;
          }
          local_248[0] = (string)local_1a8[0].has_value_;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          iVar9 = 0x665;
          goto LAB_00251fa2;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x655);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar10 = 
        "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.";
        pcVar8 = "";
        goto LAB_00251701;
      }
      this = &attr->_var;
      bVar3 = primvar::PrimVar::is_scalar(this);
      if (bVar3) {
        if ((attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar2 = (attr->_var)._value.v_.vtable;
          if (pvVar2 == (vtable_type *)0x0) {
            bVar3 = false;
          }
          else {
            uVar4 = (*pvVar2->type_id)();
            bVar3 = uVar4 == 4;
          }
          if ((bVar3) || (((attr->_var)._blocked & 1U) != 0)) goto LAB_00251f14;
        }
        primvar::PrimVar::get_value<tinyusdz::Token>(local_1a8,this);
        if (local_1a8[0].has_value_ == true) {
          if (local_1a8[0].contained.data.__align == (long)&local_1a8[0].contained + 0x10) {
            local_248._8_8_ = (long)local_238._M_local_buf + 8;
            uStack_228 = local_1a8[0].contained._24_8_;
          }
          else {
            local_248._8_8_ = local_1a8[0].contained.data.__align;
          }
          local_238._8_8_ = local_1a8[0].contained._16_8_;
          local_248[0] = (string)0x1;
          local_238._M_allocated_capacity = local_1a8[0].contained._8_8_;
          if ((enum_handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_002525ee:
            ::std::__throw_bad_function_call();
          }
          (*enum_handler->_M_invoker)
                    ((expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_218,(_Any_data *)enum_handler,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_248 + 8));
          if (local_1f8 == true) {
LAB_00252162:
            if ((result->_attrib).has_value_ == false) {
              (result->_attrib).has_value_ = true;
            }
            (result->_attrib).contained =
                 (storage_t<tinyusdz::GeomBasisCurves::Wrap>)local_218._0_4_;
            goto LAB_0025259c;
          }
          if (!strict_allowedToken_check) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            iVar9 = 0x67a;
            goto LAB_00252441;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          iVar9 = 0x678;
LAB_00252209:
          poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,iVar9);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          paVar1 = &local_1f0.field_2;
          local_1f0._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f0,"Attribute `{}`: `{}` is not an allowed token.","");
          if (local_248[0] == (string)0x0) goto LAB_002525f3;
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_1d0,(fmt *)&local_1f0,local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_248 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,
                              local_1d0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_1d0,&local_1f0,err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          bVar3 = false;
LAB_0025259e:
          if ((local_1f8 == false) && ((undefined1 *)local_218._0_8_ != local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          goto LAB_002525c0;
        }
        local_248[0] = (string)local_1a8[0].has_value_;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar9 = 0x67f;
LAB_00251fa2:
        poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,iVar9);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        paVar1 = &local_1d0.field_2;
        local_1d0._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,
                   "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                   ,"");
        Attribute::type_name_abi_cxx11_(&local_1f0,attr);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_218,(fmt *)&local_1d0,local_220,&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_218._0_8_,local_218._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_218,&local_1d0,err);
          ::std::__cxx11::string::operator=((string *)err,(string *)local_218);
          if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        bVar3 = false;
LAB_002525c0:
        if (local_248[0] != (string)0x1) {
          return bVar3;
        }
        if (local_248._8_8_ == (long)local_238._M_local_buf + 8) {
          return bVar3;
        }
        operator_delete((void *)local_248._8_8_,local_238._8_8_ + 1);
        return bVar3;
      }
      bVar3 = primvar::PrimVar::is_timesamples(this);
      if (bVar3) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x683);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar10 = "Attribute `{}` is uniform variability, but TimeSampled value is authored.";
        pcVar8 = "";
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x686);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar10 = "Internal error. Attribute `{}` is invalid";
        pcVar8 = "";
      }
      local_218._0_8_ = local_218 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_218,pcVar10,pcVar8);
      fmt::format<std::__cxx11::string>
                ((string *)local_248,(fmt *)local_218,(string *)local_220,&args->_name);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != &local_238) {
        operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) goto LAB_00251770;
    }
    if (err == (string *)0x0) goto LAB_002519af;
    ::std::__cxx11::stringbuf::str();
    plVar6 = (long *)::std::__cxx11::string::_M_append(local_218,(ulong)(err->_M_dataplus)._M_p);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar7) {
      local_238._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_238._8_8_ = plVar6[3];
      local_248._0_8_ = &local_238;
    }
    else {
      local_238._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_248._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar6 + 1);
    *plVar6 = (long)paVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != &local_238) {
      operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_218._0_8_ == local_218 + 0x10) goto LAB_002519af;
  }
  operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
LAB_002519af:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ParseUniformEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<T> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // uniform or TimeSamples
    if (attr.get_var().is_scalar()) {

      if (attr.is_blocked()) {
        result->set_blocked(true);
        return true;
      }

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          (*result) = e.value();
          return true;
        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          result->set_value_empty();
          return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    } else if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is uniform variability, but TimeSampled value is authored.",
 prop_name);

    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Attribute `{}` is invalid", prop_name);
    }

  }

  return false;
}